

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

uint64_t __thiscall rcg::Buffer::getPixelFormatNamespace(Buffer *this,uint32_t part)

{
  bool bVar1;
  void *stream;
  unsigned_long uVar2;
  
  bVar1 = this->multipart;
  stream = Stream::getHandle(this->parent);
  if (bVar1 == true) {
    uVar2 = anon_unknown_6::getBufferPartValue<unsigned_long>
                      (&this->gentl,stream,this->buffer,part,4);
    return uVar2;
  }
  uVar2 = anon_unknown_6::getBufferValue<unsigned_long>(&this->gentl,stream,this->buffer,0x15);
  return uVar2;
}

Assistant:

uint64_t Buffer::getPixelFormatNamespace(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<uint64_t>(gentl, parent->getHandle(), buffer, part,
                                        GenTL::BUFFER_PART_INFO_DATA_FORMAT_NAMESPACE);
  }
  else
  {
    return getBufferValue<uint64_t>(gentl, parent->getHandle(), buffer,
                                    GenTL::BUFFER_INFO_PIXELFORMAT_NAMESPACE);
  }
}